

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deriv.c
# Opt level: O3

void copylist(List *l,Item *i)

{
  List *pLVar1;
  
  pLVar1 = l->next;
  do {
    if (pLVar1 == l) {
      return;
    }
    if (pLVar1->itemtype == 1) {
      insertsym(i,(pLVar1->element).sym);
    }
    else {
      if (pLVar1->itemtype != 0x143) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/deriv.c"
                      ,0x3e0,"void copylist()");
      }
      insertstr(i,(pLVar1->element).str);
    }
    pLVar1 = pLVar1->next;
  } while( true );
}

Assistant:

static void copylist(l, i)	/* copy list l before item i */
	List *l;
	Item *i;
{
	Item *q;
	
	ITERATE(q, l) {
		switch(q->itemtype) {

		case STRING:
			Insertstr(i, STR(q));
			break;
		case SYMBOL:
			Insertsym(i, SYM(q));
			break;
		default:
			/*SUPPRESS 622*/
			assert(0);
		}
	}
}